

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> * __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,
          vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other)

{
  bool bVar1;
  size_t sVar2;
  Half *p;
  reference args;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RSI;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_RDI;
  size_t i;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *in_stack_ffffffffffffffd0;
  polymorphic_allocator<pbrt::Half> *in_stack_ffffffffffffffe0;
  ulong uVar3;
  ulong index;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_00;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    bVar1 = pmr::operator==(in_stack_ffffffffffffffe0,&in_RDI->alloc);
    if (bVar1) {
      swap<pbrt::Half*>(&in_RDI->ptr,&in_RSI->ptr);
      swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
      local_8 = in_RDI;
    }
    else {
      clear(in_stack_ffffffffffffffd0);
      size(in_RSI);
      reserve(this_00,(size_t)in_RSI);
      uVar3 = 0;
      while (index = uVar3, sVar2 = size(in_RSI), uVar3 < sVar2) {
        p = in_RDI->ptr + index;
        args = operator[](in_RSI,index);
        pmr::polymorphic_allocator<pbrt::Half>::construct<pbrt::Half,pbrt::Half>
                  (&in_RDI->alloc,p,args);
        uVar3 = index + 1;
      }
      sVar2 = size(in_RSI);
      in_RDI->nStored = sVar2;
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }